

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void setfvar(char *name,float f,bool dofunc,bool doclamp)

{
  ident *piVar1;
  uint uVar2;
  float fVar3;
  char *local_18;
  
  local_18 = name;
  piVar1 = hashset<ident>::access<char_const*>(&idents,&local_18);
  if (piVar1 == (ident *)0x0) {
    return;
  }
  if (piVar1->type != 1) {
    return;
  }
  uVar2 = piVar1->flags;
  if ((uVar2 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar2 & 0x10) == 0) goto LAB_0012a76d;
    uVar2 = uVar2 & 0xffffffed;
  }
  else {
    if ((uVar2 & 1) != 0) {
      debugcode("cannot override persistent variable %s",piVar1->name);
      return;
    }
    if ((uVar2 & 0x10) != 0) goto LAB_0012a76d;
    (piVar1->field_5).argmask = *(uint *)(piVar1->field_4).args;
    uVar2 = uVar2 | 0x10;
  }
  piVar1->flags = uVar2;
LAB_0012a76d:
  if (doclamp) {
    fVar3 = f;
    if ((piVar1->field_3).maxvalf <= f) {
      fVar3 = (piVar1->field_3).maxvalf;
    }
    f = (piVar1->field_2).minvalf;
    if ((piVar1->field_2).minvalf <= fVar3) {
      f = fVar3;
    }
  }
  *(float *)(piVar1->field_4).args = f;
  if ((dofunc) && (piVar1->fun != (identfun)0x0)) {
    (*piVar1->fun)();
  }
  return;
}

Assistant:

void setfvar(const char *name, float f, bool dofunc, bool doclamp)
{
    _GETVAR(id, ID_FVAR, name, );
    OVERRIDEVAR(return, id->overrideval.f = *id->storage.f, , );
    if(doclamp) *id->storage.f = clamp(f, id->minvalf, id->maxvalf);
    else *id->storage.f = f;
    if(dofunc) id->changed();
}